

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigopcount_tests.cpp
# Opt level: O2

void sigopcount_tests::BuildTxs
               (CMutableTransaction *spendingTx,CCoinsViewCache *coins,
               CMutableTransaction *creationTx,CScript *scriptPubKey,CScript *scriptSig,
               CScriptWitness *witness)

{
  pointer pCVar1;
  pointer pCVar2;
  long in_FS_OFFSET;
  undefined1 local_b8 [24];
  pointer pCStack_a0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  creationTx->version = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&creationTx->vin,1);
  COutPoint::SetNull(&((creationTx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start)->prevout);
  local_b8._16_8_ = 0;
  pCStack_a0 = (pointer)0x0;
  local_b8._0_8_ = (char *)0x0;
  local_b8._8_8_ = 0;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&(((creationTx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_b8);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_b8);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&creationTx->vout,1);
  pCVar1 = (creationTx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1->nValue = 1;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&(pCVar1->scriptPubKey).super_CScriptBase,&scriptPubKey->super_CScriptBase);
  spendingTx->version = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&spendingTx->vin,1);
  CMutableTransaction::GetHash((Txid *)local_b8,creationTx);
  pCVar2 = (spendingTx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(undefined8 *)((long)&(pCVar2->prevout).hash + 0x10) = local_b8._16_8_;
  *(pointer *)((long)&(pCVar2->prevout).hash + 0x18) = pCStack_a0;
  *(undefined8 *)&(pCVar2->prevout).hash = local_b8._0_8_;
  *(undefined8 *)((long)&(pCVar2->prevout).hash + 8) = local_b8._8_8_;
  pCVar2 = (spendingTx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  (pCVar2->prevout).n = 0;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&(pCVar2->scriptSig).super_CScriptBase,&scriptSig->super_CScriptBase);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=(&(((spendingTx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->scriptWitness).stack,&witness->stack);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&spendingTx->vout,1);
  pCVar1 = (spendingTx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1->nValue = 1;
  local_b8._16_8_ = 0;
  pCStack_a0 = (pointer)0x0;
  local_b8._0_8_ = (char *)0x0;
  local_b8._8_8_ = 0;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&(pCVar1->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_b8);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_b8);
  CTransaction::CTransaction((CTransaction *)local_b8,creationTx);
  AddCoins(coins,(CTransaction *)local_b8,0,false);
  CTransaction::~CTransaction((CTransaction *)local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void BuildTxs(CMutableTransaction& spendingTx, CCoinsViewCache& coins, CMutableTransaction& creationTx, const CScript& scriptPubKey, const CScript& scriptSig, const CScriptWitness& witness)
{
    creationTx.version = 1;
    creationTx.vin.resize(1);
    creationTx.vin[0].prevout.SetNull();
    creationTx.vin[0].scriptSig = CScript();
    creationTx.vout.resize(1);
    creationTx.vout[0].nValue = 1;
    creationTx.vout[0].scriptPubKey = scriptPubKey;

    spendingTx.version = 1;
    spendingTx.vin.resize(1);
    spendingTx.vin[0].prevout.hash = creationTx.GetHash();
    spendingTx.vin[0].prevout.n = 0;
    spendingTx.vin[0].scriptSig = scriptSig;
    spendingTx.vin[0].scriptWitness = witness;
    spendingTx.vout.resize(1);
    spendingTx.vout[0].nValue = 1;
    spendingTx.vout[0].scriptPubKey = CScript();

    AddCoins(coins, CTransaction(creationTx), 0);
}